

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu1.c
# Opt level: O3

MPP_RET vdpu1_h264d_deinit(void *hal)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  bool bVar4;
  
  iVar1 = *(int *)((long)hal + 0x98);
  puVar3 = (undefined8 *)(*(long *)((long)hal + 0x90) + 0x28);
  uVar2 = 0;
  do {
    if ((void *)*puVar3 != (void *)0x0) {
      mpp_osal_free("vdpu1_h264d_deinit",(void *)*puVar3);
    }
    *puVar3 = 0;
    mpp_buffer_put_with_caller((MppBuffer)puVar3[-4],"vdpu1_h264d_deinit");
    if (iVar1 == 0) break;
    puVar3 = puVar3 + 6;
    bVar4 = uVar2 < 2;
    uVar2 = uVar2 + 1;
  } while (bVar4);
  if (*(void **)((long)hal + 0x90) != (void *)0x0) {
    mpp_osal_free("vdpu1_h264d_deinit",*(void **)((long)hal + 0x90));
  }
  *(undefined8 *)((long)hal + 0x90) = 0;
  if (*(void **)((long)hal + 0x40) != (void *)0x0) {
    mpp_osal_free("vdpu1_h264d_deinit",*(void **)((long)hal + 0x40));
  }
  *(undefined8 *)((long)hal + 0x40) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu1_h264d_deinit(void *hal)
{
    H264dHalCtx_t  *p_hal = (H264dHalCtx_t *)hal;
    H264dVdpuRegCtx_t *reg_ctx = (H264dVdpuRegCtx_t *)p_hal->reg_ctx;

    RK_U32 i = 0;
    RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    for (i = 0; i < loop; i++) {
        MPP_FREE(reg_ctx->reg_buf[i].regs);
        mpp_buffer_put(reg_ctx->reg_buf[i].buf);
    }
    MPP_FREE(p_hal->reg_ctx);
    MPP_FREE(p_hal->priv);

    return MPP_OK;
}